

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsgexp(prscxdef *ctx,prsndef *n)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  tokdef *tok;
  errcxdef *ctx_00;
  prscxdef *in_RSI;
  long in_RDI;
  uint ldone;
  uint lfalse;
  uint cnt_1;
  prsndef *nsub;
  uint lab;
  int cnt;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  ushort in_stack_ffffffffffffffae;
  errcxdef *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uchar uVar5;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffdc;
  uint i;
  prscxdef *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  prscxdef *ctx_01;
  
  tok = (tokdef *)(ulong)*(uint *)((long)&in_RSI->prscxerr + 4);
  switch(tok) {
  case (tokdef *)0x0:
    prsdef((prscxdef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),tok,
           in_stack_ffffffffffffffc4);
    emtval((emtcxdef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),tok,
           (uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    break;
  case (tokdef *)0x1:
    iVar4 = *(int *)&in_RSI->prscxerr;
    if (((1 < iVar4 - 2U) && (iVar4 != 6)) && (iVar4 != 0x1e)) {
      if (iVar4 == 0x32) {
        prsgfn((prscxdef *)CONCAT44(0x32,in_stack_ffffffffffffffc0),
               (prsndef *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        return;
      }
      if (1 < iVar4 - 0x5eU) {
        if (iVar4 - 0x96U < 4) {
          prsglval(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                   (prsndef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
          return;
        }
        errsigf(in_stack_ffffffffffffffb0,
                (char *)CONCAT26(in_stack_ffffffffffffffae,
                                 CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),0);
      }
    }
    prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (*(int *)&in_RSI->prscxerr != 2) {
      emtres((emtcxdef *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae);
      if (*(int *)&in_RSI->prscxerr == 3) {
        uVar6 = 3;
      }
      else if (*(int *)&in_RSI->prscxerr == 0x1e) {
        uVar6 = 0x57;
      }
      else if (*(int *)&in_RSI->prscxerr == 0x5e) {
        uVar6 = 0x5a;
      }
      else {
        uVar6 = 4;
        if (*(int *)&in_RSI->prscxerr == 0x5f) {
          uVar6 = 0x5b;
        }
      }
      lVar2 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
      uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
      *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
      *(undefined1 *)(lVar2 + (int)(uint)uVar1) = uVar6;
    }
    break;
  case (tokdef *)0x2:
    ctx_00 = (errcxdef *)(ulong)(*(int *)&in_RSI->prscxerr - 2);
    switch(ctx_00) {
    case (errcxdef *)0x0:
    case (errcxdef *)0x1:
    case (errcxdef *)0x2:
    case (errcxdef *)0x3:
    case (errcxdef *)0x5:
    case (errcxdef *)0x6:
    case (errcxdef *)0x7:
    case (errcxdef *)0x8:
    case (errcxdef *)0x9:
    case (errcxdef *)0xa:
    case (errcxdef *)0xb:
    case (errcxdef *)0xc:
    case (errcxdef *)0xd:
    case (errcxdef *)0xe:
    case (errcxdef *)0xf:
    case (errcxdef *)0x10:
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffae);
      uVar5 = prsbopl[*(int *)&in_RSI->prscxerr + -2];
      lVar2 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
      uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
      *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
      *(uchar *)(lVar2 + (int)(uint)uVar1) = uVar5;
      break;
    default:
      errsigf(ctx_00,(char *)CONCAT26(in_stack_ffffffffffffffae,
                                      CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
              ,0);
    case (errcxdef *)0x1d:
      prsgdotspec((prscxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (prsndef *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      break;
    case (errcxdef *)0x30:
      prsgargs((prscxdef *)ctx_00,
               (prsndef *)
               CONCAT26(in_stack_ffffffffffffffae,
                        CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)));
      prsgfn((prscxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (prsndef *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (int)((ulong)ctx_00 >> 0x20));
      break;
    case (errcxdef *)0x38:
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffae);
      lVar2 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
      uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
      *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
      *(undefined1 *)(lVar2 + (int)(uint)uVar1) = 0x40;
      break;
    case (errcxdef *)0x39:
      i = 0;
      ctx_01 = in_RSI;
      for (; in_RSI != (prscxdef *)0x0; in_RSI = (prscxdef *)in_RSI->prscxstab) {
        prsgexp(ctx_01,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
        i = i + 1;
      }
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffae);
      lVar2 = *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
      uVar1 = *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12);
      *(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) = uVar1 + 1;
      *(undefined1 *)(lVar2 + (int)(uint)uVar1) = 0x4a;
      emtres((emtcxdef *)ctx_00,in_stack_ffffffffffffffae);
      oswp2((void *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x18) +
                    (long)(int)(uint)*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12)),i);
      *(short *)(*(long *)(in_RDI + 0x28) + 0x12) = *(short *)(*(long *)(in_RDI + 0x28) + 0x12) + 2;
      break;
    case (errcxdef *)0x3d:
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      break;
    case (errcxdef *)0x3e:
      prsgdot(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
              (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
      break;
    case (errcxdef *)0x3f:
    case (errcxdef *)0x40:
      uVar3 = emtglbl((emtcxdef *)ctx_00);
      uVar5 = (uchar)((uint)in_stack_ffffffffffffffbc >> 0x18);
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,uVar3));
      emtjmp((emtcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar5,
             in_stack_ffffffffffffffb8);
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,uVar3));
      emtslbl((emtcxdef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(uint *)tok,
              in_stack_ffffffffffffffc4);
      break;
    case (errcxdef *)0x98:
    case (errcxdef *)0x99:
    case (errcxdef *)0x9a:
    case (errcxdef *)0x9b:
    case (errcxdef *)0x9c:
    case (errcxdef *)0x9d:
    case (errcxdef *)0x9e:
    case (errcxdef *)0x9f:
    case (errcxdef *)0xa0:
    case (errcxdef *)0xa1:
    case (errcxdef *)0xa2:
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      prsglval(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
               (prsndef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    break;
  case (tokdef *)0x3:
    iVar4 = *(int *)&in_RSI->prscxerr;
    if (iVar4 == 0x40) {
      iVar4 = prsgargs((prscxdef *)in_stack_ffffffffffffffb0,
                       (prsndef *)
                       CONCAT26((short)((uint)iVar4 >> 0x10),
                                CONCAT24((short)iVar4,in_stack_ffffffffffffffa8)));
      prsgdot(in_RSI,(prsndef *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),
              (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    }
    else if (iVar4 == 0x56) {
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      uVar5 = (uchar)((uint)in_stack_ffffffffffffffbc >> 0x18);
      emtglbl((emtcxdef *)in_stack_ffffffffffffffb0);
      emtjmp((emtcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar5,
             in_stack_ffffffffffffffb8);
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      uVar3 = emtglbl((emtcxdef *)in_stack_ffffffffffffffb0);
      emtjmp((emtcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar5,
             in_stack_ffffffffffffffb8);
      emtslbl((emtcxdef *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),(uint *)tok,
              in_stack_ffffffffffffffc4);
      prsgexp(in_RSI,(prsndef *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      emtslbl((emtcxdef *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),(uint *)tok,
              in_stack_ffffffffffffffc4);
    }
  }
  return;
}

Assistant:

void prsgexp(prscxdef *ctx, prsndef *n)
{
    int cnt;
    
    switch(n->prsnnlf)
    {
    case 0:
        prsdef(ctx, &n->prsnv.prsnvt, TOKSTFWDOBJ);
        emtval(ctx->prscxemt, &n->prsnv.prsnvt, ctx->prscxpool);
        break;
        
    case 1:
        switch(n->prsntyp)
        {
        case TOKTINC:
        case TOKTDEC:
        case TOKTPOSTINC:
        case TOKTPOSTDEC:
            prsglval(ctx, n->prsntyp, n->prsnv.prsnvn[0]);
            break;
            
        case TOKTPLUS:
        case TOKTMINUS:
        case TOKTNOT:
        case TOKTTILDE:
        case TOKTNEW:
        case TOKTDELETE:
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            if (n->prsntyp != TOKTPLUS)
                emtop(ctx->prscxemt,
                      n->prsntyp == TOKTMINUS ? OPCNEG :
                      n->prsntyp == TOKTTILDE ? OPCBNOT :
                      n->prsntyp == TOKTNEW ? OPCNEW :
                      n->prsntyp == TOKTDELETE ? OPCDELETE :
                      OPCNOT);
            break;

        case TOKTLPAR:
            prsgfn(ctx, n->prsnv.prsnvn[0], 0);
            break;

        default:
            errsig(ctx->prscxerr, ERR_REQUNO);
        }
        break;
        
    case 2:
        switch(n->prsntyp)
        {
        case TOKTAND:
        case TOKTOR:
        {
            uint lab;
            
            lab = emtglbl(ctx->prscxemt);
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            emtjmp(ctx->prscxemt,
                   (uchar)(n->prsntyp == TOKTAND ? OPCJSF : OPCJST),
                   lab);
            prsgexp(ctx, n->prsnv.prsnvn[1]);
            emtslbl(ctx->prscxemt, &lab, TRUE);
            break;
        }
        
        case TOKTPLUS:
        case TOKTMINUS:
        case TOKTDIV:
        case TOKTMOD:
        case TOKTTIMES:
        case TOKTEQ:
        case TOKTNE:
        case TOKTGT:
        case TOKTGE:
        case TOKTLT:
        case TOKTLE:
        case TOKTBAND:
        case TOKTBOR:
        case TOKTXOR:
        case TOKTSHL:
        case TOKTSHR:
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            prsgexp(ctx, n->prsnv.prsnvn[1]);
            emtop(ctx->prscxemt, prsbopl[n->prsntyp - TOKTPLUS]);
            break;
            
        case TOKTCOMMA:
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            prsgexp(ctx, n->prsnv.prsnvn[1]);
            break;
            
        case TOKTLPAR:                      /* function call with arguments */
            cnt = prsgargs(ctx, n->prsnv.prsnvn[1]);      /* push arguments */
            prsgfn(ctx, n->prsnv.prsnvn[0], cnt);
            break;
        
        case TOKTASSIGN:
        case TOKTPLEQ:
        case TOKTMINEQ:
        case TOKTDIVEQ:
        case TOKTMODEQ:
        case TOKTTIMEQ:
        case TOKTBANDEQ:
        case TOKTBOREQ:
        case TOKTXOREQ:
        case TOKTSHLEQ:
        case TOKTSHREQ:
            prsgexp(ctx, n->prsnv.prsnvn[1]);      /* eval right side of := */
            prsglval(ctx, n->prsntyp, n->prsnv.prsnvn[0]);
            break;
            
        case TOKTDOT:
            prsgdot(ctx, n, 0);
            break;

        case TOKTDOTSPEC:
            prsgdotspec(ctx, n);
            break;
            
        case TOKTLBRACK:
            prsgexp(ctx, n->prsnv.prsnvn[0]);    /* push list being indexed */
            prsgexp(ctx, n->prsnv.prsnvn[1]);       /* push the index value */
            emtop(ctx->prscxemt, OPCINDEX);
            break;
        
        case TOKTRBRACK:
        {
            prsndef *nsub;
            uint     cnt;
            
            for (cnt = 0, nsub = n ; nsub
                 ; ++cnt, nsub = nsub->prsnv.prsnvn[1])
                prsgexp(ctx, nsub->prsnv.prsnvn[0]);
            emtop(ctx->prscxemt, OPCCONS);         /* construction operator */
            emtint2(ctx->prscxemt, cnt);
            break;
        }
            
        default:
            errsig(ctx->prscxerr, ERR_INVBIN);
        }
        break;

    case 3:
        switch(n->prsntyp)
        {
        case TOKTQUESTION:
        {
            uint lfalse;                          /* label for FALSE branch */
            uint ldone;                       /* label for end of condition */
            
            prsgexp(ctx, n->prsnv.prsnvn[0]);         /* evaluate condition */
            lfalse = emtglbl(ctx->prscxemt);
            emtjmp(ctx->prscxemt, OPCJF, lfalse);
            prsgexp(ctx, n->prsnv.prsnvn[1]);             /* eval TRUE expr */
            ldone = emtglbl(ctx->prscxemt);
            emtjmp(ctx->prscxemt, OPCJMP, ldone);
            emtslbl(ctx->prscxemt, &lfalse, TRUE);
            prsgexp(ctx, n->prsnv.prsnvn[2]);          /* eval FALSE branch */
            emtslbl(ctx->prscxemt, &ldone, TRUE);
            break;
        }
        case TOKTDOT:
            cnt = prsgargs(ctx, n->prsnv.prsnvn[2]);
            prsgdot(ctx, n, cnt);
            break;
        }
        break;
    }
}